

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O2

void TranslateModuleGlobalVariables(ExpressionTranslateContext *ctx)

{
  VariableData *variable;
  TypeBase *pTVar1;
  _func_int **pp_Var2;
  bool bVar3;
  VariableData **ppVVar4;
  ScopeData *pSVar5;
  uint i;
  uint index;
  char *pcVar6;
  ExpressionContext *this;
  char cVar7;
  InplaceStr local_50;
  InplaceStr local_40;
  
  PrintIndentedLine(ctx,"// Global variables");
  index = 0;
  do {
    if ((ctx->ctx->variables).count <= index) {
      PrintLine(ctx);
      return;
    }
    ppVVar4 = SmallArray<VariableData_*,_128U>::operator[](&ctx->ctx->variables,index);
    variable = *ppVVar4;
    if (variable->isVmAlloca == false) {
      pTVar1 = variable->type;
      this = ctx->ctx;
      if (pTVar1 != this->typeVoid) {
        if ((((pTVar1 == (TypeBase *)0x0) || (pTVar1->typeID != 0x12)) ||
            (pp_Var2 = pTVar1[1]._vptr_TypeBase, pp_Var2 == (_func_int **)0x0)) ||
           (*(int *)(pp_Var2 + 1) != 0x18)) {
          cVar7 = '\0';
        }
        else {
          cVar7 = *(char *)((long)pp_Var2 + 0x121);
        }
        if (variable->importModule == (ModuleData *)0x0) {
          pcVar6 = (variable->name->name).begin;
          if (4 < (uint)(*(int *)&(variable->name->name).end - (int)pcVar6)) {
            local_40.end = pcVar6 + 5;
            local_50.begin = "$temp";
            local_50.end = "";
            local_40.begin = pcVar6;
            bVar3 = InplaceStr::operator==(&local_40,&local_50);
            pcVar6 = "static ";
            if (bVar3) goto LAB_0014168e;
            this = ctx->ctx;
          }
          pSVar5 = variable->scope;
          if ((pSVar5 == this->globalScope) || (pSVar5->ownerNamespace != (NamespaceData *)0x0)) {
            pcVar6 = "static ";
            if (cVar7 != '\0') goto LAB_0014168e;
          }
          else {
            pSVar5 = ExpressionContext::GlobalScopeFrom(this,pSVar5);
            pcVar6 = "static ";
            if (pSVar5 == (ScopeData *)0x0) goto LAB_001416d1;
LAB_0014168e:
            Print(ctx,pcVar6);
          }
          TranslateTypeName(ctx,variable->type);
          Print(ctx," ");
          TranslateVariableName(ctx,variable);
          Print(ctx,";");
          PrintLine(ctx);
        }
        else {
          pcVar6 = "extern ";
          if (cVar7 == '\0') goto LAB_0014168e;
        }
      }
    }
LAB_001416d1:
    index = index + 1;
  } while( true );
}

Assistant:

void TranslateModuleGlobalVariables(ExpressionTranslateContext &ctx)
{
	PrintIndentedLine(ctx, "// Global variables");

	for(unsigned int i = 0; i < ctx.ctx.variables.size(); i++)
	{
		VariableData *variable = ctx.ctx.variables[i];

		// Don't need variables allocated by intermediate vm compilation
		if(variable->isVmAlloca)
			continue;

		if(variable->type == ctx.ctx.typeVoid)
			continue;

		bool isInternalFunctionContext = false;

		if(TypeRef *typeRef = getType<TypeRef>(variable->type))
		{
			if(TypeClass *typeClass = getType<TypeClass>(typeRef->subType))
				isInternalFunctionContext = typeClass->isInternal;
		}

		InplaceStr name = variable->name->name;

		if(variable->importModule)
		{
			// Skip internal function context
			if(isInternalFunctionContext)
				continue;

			Print(ctx, "extern ");
			TranslateTypeName(ctx, variable->type);
			Print(ctx, " ");
			TranslateVariableName(ctx, variable);
			Print(ctx, ";");
			PrintLine(ctx);
		}
		else if(name.length() >= 5 && InplaceStr(name.begin, name.begin + 5) == InplaceStr("$temp"))
		{
			Print(ctx, "static ");
			TranslateTypeName(ctx, variable->type);
			Print(ctx, " ");
			TranslateVariableName(ctx, variable);
			Print(ctx, ";");
			PrintLine(ctx);
		}
		else if(variable->scope == ctx.ctx.globalScope || variable->scope->ownerNamespace)
		{
			// Do not export internal function context
			if(isInternalFunctionContext)
				Print(ctx, "static ");

			TranslateTypeName(ctx, variable->type);
			Print(ctx, " ");
			TranslateVariableName(ctx, variable);
			Print(ctx, ";");
			PrintLine(ctx);
		}
		else if(ctx.ctx.GlobalScopeFrom(variable->scope))
		{
			Print(ctx, "static ");
			TranslateTypeName(ctx, variable->type);
			Print(ctx, " ");
			TranslateVariableName(ctx, variable);
			Print(ctx, ";");
			PrintLine(ctx);
		}
	}

	PrintLine(ctx);
}